

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O0

void __thiscall MDIOAnalyzer::~MDIOAnalyzer(MDIOAnalyzer *this)

{
  MDIOAnalyzer *this_local;
  
  ~MDIOAnalyzer(this);
  operator_delete(this);
  return;
}

Assistant:

MDIOAnalyzer::~MDIOAnalyzer()
{
    KillThread();
}